

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  string *in_RDI;
  undefined8 in_stack_ffffffffffffff78;
  AST *p;
  string *fileName_;
  RecognitionException *this_00;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  BitSet *in_stack_ffffffffffffffc0;
  undefined1 local_29 [41];
  
  this_00 = (RecognitionException *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  fileName_ = (string *)&local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  RecognitionException::RecognitionException
            (this_00,in_RDI,fileName_,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  *(undefined ***)in_RDI = &PTR__MismatchedTokenException_0034ad58;
  p = (AST *)&in_RDI[2].field_2;
  TokenRefCount<antlr::Token>::TokenRefCount((TokenRefCount<antlr::Token> *)fileName_,(Token *)p);
  ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)fileName_,p);
  std::__cxx11::string::string((string *)(in_RDI + 3));
  BitSet::BitSet(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  *(undefined8 *)((long)&in_RDI[5].field_2 + 8) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
  : RecognitionException("Mismatched Token: expecting any AST node","<AST>",-1,-1)
  , token(0)
  , node(nullASTptr)
  , tokenNames(0)
  , numTokens(0)
{
}